

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.cpp
# Opt level: O0

void * PathfinderDVLThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double local_eb8;
  double local_eb0;
  interval local_ea8;
  double local_e90;
  interval local_e88;
  interval local_e70;
  double local_e58;
  double local_e50;
  interval local_e48;
  double local_e30;
  double local_e28;
  interval local_e20;
  double local_e08;
  double local_e00;
  interval local_df8;
  double local_de0;
  interval local_dd8;
  interval local_dc0;
  interval local_da8;
  double local_d90;
  interval local_d88;
  double local_d70;
  interval local_d68;
  interval local_d50;
  double local_d38;
  interval local_d30;
  interval local_d18;
  interval local_d00;
  double local_ce8;
  interval local_ce0;
  interval local_cc8;
  interval local_cb0;
  double local_c98;
  interval local_c90;
  double local_c78;
  interval local_c70;
  interval local_c58;
  double local_c40;
  interval local_c38;
  double local_c20;
  interval local_c18;
  interval local_c00;
  char local_be8 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_9e0;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  undefined1 local_988 [4];
  BOOL bConnected;
  NMEADATA nmeadata;
  PATHFINDERDVL pathfinderdvl;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  i = 100;
  local_9e0 = 0;
  pathfinderdvl._1432_8_ = pParam;
  memset(&nmeadata.AIS_COG,0,0x5a0);
  memset(local_988,0,0x3d8);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      if (bPausePathfinderDVL == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("PathfinderDVL paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectPathfinderDVL((PATHFINDERDVL *)&nmeadata.AIS_COG);
      }
      if (bExit != 0) goto LAB_001be8c6;
      mSleep(100);
    }
    if (bRestartPathfinderDVL != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a PathfinderDVL.\n");
        chrono_period._68_4_ = 0;
        DisconnectPathfinderDVL((PATHFINDERDVL *)&nmeadata.AIS_COG);
      }
      bRestartPathfinderDVL = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectPathfinderDVL((PATHFINDERDVL *)&nmeadata.AIS_COG,"PathfinderDVL0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = pathfinderdvl.BaudRate;
        memset(local_988,0,0x3d8);
        if (pathfinderdvl.RS232Port._784_8_ != 0) {
          fclose((FILE *)pathfinderdvl.RS232Port._784_8_);
          pathfinderdvl.RS232Port.DevType = 0;
          pathfinderdvl.RS232Port._788_4_ = 0;
        }
        if ((pathfinderdvl.timeout != 0) && (pathfinderdvl.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)&pathfinderdvl.pfSaveFile);
          if (sVar2 == 0) {
            sprintf(local_be8,"pathfinderdvl");
          }
          else {
            sprintf(local_be8,"%.127s",&pathfinderdvl.pfSaveFile);
          }
          sVar2 = strlen(local_be8);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (local_be8[(int)szSaveFilePath._252_4_] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen(local_be8), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen(local_be8);
            memset(local_be8 + (int)szSaveFilePath._252_4_,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_be8,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          pathfinderdvl.RS232Port._784_8_ = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)pathfinderdvl.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create PathfinderDVL data file.\n");
            goto LAB_001be8c6;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetNMEASentencePathfinderDVL((PATHFINDERDVL *)&nmeadata.AIS_COG,(NMEADATA *)local_988)
      ;
      if (iVar1 == 0) {
        EnterCriticalSection(&StateVariablesCS);
        if ((((pathfinderdvl.bKeepAsUserDefaults != 0) || (pathfinderdvl.bStartPinging != 0)) ||
            (pathfinderdvl.bEnable_PD6_SA != 0)) ||
           (((pathfinderdvl.bEnable_PD6_TS != 0 || (pathfinderdvl.bEnable_PD6_BI != 0)) ||
            (pathfinderdvl.bEnable_PD6_BS != 0)))) {
          if (pathfinderdvl.bKeepAsUserDefaults != 0) {
            local_c20 = fmod_2PI((1.5707963267948966 - nmeadata.Pitch) - angle_env);
            interval::interval(&local_c18,&local_c20);
            local_c40 = -psi_ahrs_acc;
            interval::interval(&local_c38,&local_c40,&psi_ahrs_acc);
            operator+(&local_c00,&local_c18,&local_c38);
            interval::operator=((interval *)&psi_ahrs,&local_c00);
            local_c78 = -nmeadata.Roll;
            interval::interval(&local_c70,&local_c78);
            local_c98 = -theta_ahrs_acc;
            interval::interval(&local_c90,&local_c98,&theta_ahrs_acc);
            operator+(&local_c58,&local_c70,&local_c90);
            interval::operator=((interval *)&theta_ahrs,&local_c58);
            interval::interval(&local_cc8,&nmeadata.second);
            local_ce8 = -phi_ahrs_acc;
            interval::interval(&local_ce0,&local_ce8,&phi_ahrs_acc);
            operator+(&local_cb0,&local_cc8,&local_ce0);
            interval::operator=((interval *)&phi_ahrs,&local_cb0);
          }
          if (pathfinderdvl.bEnable_PD6_TS != 0) {
            if (nmeadata.v_up._1_1_ == 'A') {
              interval::interval(&local_d18,&nmeadata.vt_ship);
              local_d38 = -dvl_acc;
              interval::interval(&local_d30,&local_d38,&dvl_acc);
              operator+(&local_d00,&local_d18,&local_d30);
              interval::operator=((interval *)&vrx_dvl,&local_d00);
              local_d70 = -nmeadata.verr_dvl;
              interval::interval(&local_d68,&local_d70);
              local_d90 = -dvl_acc;
              interval::interval(&local_d88,&local_d90,&dvl_acc);
              operator+(&local_d50,&local_d68,&local_d88);
              interval::operator=((interval *)&vry_dvl,&local_d50);
              interval::interval(&local_dc0,&nmeadata.vl_ship);
              local_de0 = -dvl_acc;
              interval::interval(&local_dd8,&local_de0,&dvl_acc);
              operator+(&local_da8,&local_dc0,&local_dd8);
              interval::operator=((interval *)&vrz_dvl,&local_da8);
            }
            else if (nmeadata.v_up._1_1_ == 'V') {
              local_e00 = -10000.0;
              local_e08 = 10000.0;
              interval::interval(&local_df8,&local_e00,&local_e08);
              interval::operator=((interval *)&vrx_dvl,&local_df8);
              local_e28 = -10000.0;
              local_e30 = 10000.0;
              interval::interval(&local_e20,&local_e28,&local_e30);
              interval::operator=((interval *)&vry_dvl,&local_e20);
              local_e50 = -10000.0;
              local_e58 = 10000.0;
              interval::interval(&local_e48,&local_e50,&local_e58);
              interval::operator=((interval *)&vrz_dvl,&local_e48);
            }
          }
          if ((pathfinderdvl.bEnable_PD6_BI != 0) && (nmeadata.v_up._2_1_ == 'A')) {
            sog = nmeadata.Altitude_AGL;
            local_e90 = fmod_2PI((1.5707963267948966 - nmeadata.SOG) - angle_env);
            interval::interval(&local_e88,&local_e90);
            local_eb0 = -3.141592653589793;
            local_eb8 = 3.141592653589793;
            interval::interval(&local_ea8,&local_eb0,&local_eb8);
            operator+(&local_e70,&local_e88,&local_ea8);
            interval::operator=((interval *)&psi_dvl,&local_e70);
          }
          if ((pathfinderdvl.bEnable_PD6_BS != 0) && (nmeadata.rangetobottom < 4.0)) {
            altitude_AGL = nmeadata.Altitude;
          }
        }
        LeaveCriticalSection(&StateVariablesCS);
      }
      else {
        printf("Connection to a PathfinderDVL lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectPathfinderDVL((PATHFINDERDVL *)&nmeadata.AIS_COG);
        mSleep((long)i);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_9e0 = local_9e0 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_9e0)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001be8c6:
      StopChronoQuick((CHRONO *)&errcount);
      if (pathfinderdvl.RS232Port._784_8_ != 0) {
        fclose((FILE *)pathfinderdvl.RS232Port._784_8_);
        pathfinderdvl.RS232Port.DevType = 0;
        pathfinderdvl.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectPathfinderDVL((PATHFINDERDVL *)&nmeadata.AIS_COG);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE PathfinderDVLThread(void* pParam)
{
	PATHFINDERDVL pathfinderdvl;
	NMEADATA nmeadata;
	//double vrx = 0, vry = 0, vrz = 0, alt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&pathfinderdvl, 0, sizeof(PATHFINDERDVL));
	
	memset(&nmeadata, 0, sizeof(nmeadata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPausePathfinderDVL)
		{
			if (bConnected)
			{
				printf("PathfinderDVL paused.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartPathfinderDVL)
		{
			if (bConnected)
			{
				printf("Restarting a PathfinderDVL.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
			}
			bRestartPathfinderDVL = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectPathfinderDVL(&pathfinderdvl, "PathfinderDVL0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = pathfinderdvl.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (pathfinderdvl.pfSaveFile != NULL)
				{
					fclose(pathfinderdvl.pfSaveFile); 
					pathfinderdvl.pfSaveFile = NULL;
				}
				if ((pathfinderdvl.bSaveRawData)&&(pathfinderdvl.pfSaveFile == NULL)) 
				{
					if (strlen(pathfinderdvl.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", pathfinderdvl.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "pathfinderdvl");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					pathfinderdvl.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (pathfinderdvl.pfSaveFile == NULL) 
					{
						printf("Unable to create PathfinderDVL data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetNMEASentencePathfinderDVL(&pathfinderdvl, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				if (pathfinderdvl.bEnable_PD6_SA||pathfinderdvl.bEnable_PD6_TS||pathfinderdvl.bEnable_PD6_BI||pathfinderdvl.bEnable_PD6_BS||
					pathfinderdvl.bEnable_PD6_BE||pathfinderdvl.bEnable_PD6_BD)
				{
					if (pathfinderdvl.bEnable_PD6_SA)
					{
						psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
						theta_ahrs = -nmeadata.Pitch+interval(-theta_ahrs_acc, theta_ahrs_acc);
						phi_ahrs = nmeadata.Roll+interval(-phi_ahrs_acc, phi_ahrs_acc);
					}

					if (pathfinderdvl.bEnable_PD6_BS)
					{
						if (nmeadata.vstatus_ship == 'A')
						{
							vrx_dvl = nmeadata.vl_ship+interval(-dvl_acc, dvl_acc);
							vry_dvl = -nmeadata.vt_ship+interval(-dvl_acc, dvl_acc);
							vrz_dvl = nmeadata.vn_ship+interval(-dvl_acc, dvl_acc);
						}
						else if (nmeadata.vstatus_ship == 'V')
						{
							vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
						}
					}

					if (pathfinderdvl.bEnable_PD6_BE)
					{
						if (nmeadata.vstatus_earth == 'A')
						{
							sog = nmeadata.SOG;
							psi_dvl = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
						}
					}

					if (pathfinderdvl.bEnable_PD6_BD)
					{
						if (nmeadata.timesincelastgood < 4) altitude_AGL = nmeadata.Altitude_AGL;
					}
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a PathfinderDVL lost.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
				mSleep(threadperiod);
			}
		}

		//printf("PathfinderDVLThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (pathfinderdvl.pfSaveFile != NULL)
	{
		fclose(pathfinderdvl.pfSaveFile); 
		pathfinderdvl.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectPathfinderDVL(&pathfinderdvl);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}